

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test1::iterate(GPUShaderFP64Test1 *this)

{
  bool *pbVar1;
  bool bVar2;
  NotSupportedError *this_00;
  char *description;
  allocator<char> local_39;
  string local_38;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (bVar2) {
    initTest(this);
    bVar2 = verifyErrorGenerationWhenUniformFunctionsCalledWithoutActivePO(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingMismatchedDoubleUniformFunctions(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidLocation(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidCount(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingDoubleUniformFunctionsForSamplers(this);
    this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
    bVar2 = verifyErrorGenerationWhenCallingDoubleUniformFunctionsForBooleans(this);
    pbVar1 = &this->m_has_test_passed;
    *pbVar1 = (bool)(*pbVar1 & bVar2);
    if (*pbVar1 == false) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(*pbVar1 == false),description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_ARB_gpu_shader_fp64 is not supported.",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test1::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize all ES objects required to run all the checks */
	initTest();

	/* Make sure GL_INVALID_OPERATION is generated by glUniform*() and
	 * glUniformMatrix*() functions if there is no current program object.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenUniformFunctionsCalledWithoutActivePO();

	/* Make sure GL_INVALID_OPERATION is generated by glUniform*() if
	 * the size of the uniform variable declared in the shader does not
	 * match the size indicated by the command.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions();

	/* Make sure GL_INVALID_OPERATION is generated if glUniform*() and
	 * glUniformMatrix*() are used to load a uniform variable of type
	 * bool, bvec2, bvec3, bvec4, float, int, ivec2, ivec3, ivec4,
	 * unsigned int, uvec2, uvec3, uvec4, vec2, vec3, vec4 or an array
	 * of these.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions();

	/* Make sure GL_INVALID_OPERATION is generated if glUniform*() and
	 * glUniformMatrix*() are used to load incompatible double-typed
	 * uniforms, as presented below:
	 *
	 * I.    double-typed uniform configured by glUniform2d();
	 * II.   double-typed uniform configured by glUniform3d();
	 * III.  double-typed uniform configured by glUniform4d();
	 * IV.   double-typed uniform configured by glUniformMatrix*();
	 * V.    dvec2-typed  uniform configured by glUniform1d();
	 * VI.   dvec2-typed  uniform configured by glUniform3d();
	 * VII.  dvec2-typed  uniform configured by glUniform4d();
	 * VIII. dvec2-typed  uniform configured by glUniformMatrix*();
	 *
	 *                          (etc.)
	 *
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingMismatchedDoubleUniformFunctions();

	/* Make sure GL_INVALID_OPERATION is generated if <location> of
	 * glUniform*() and glUniformMatrix*() is an invalid uniform
	 * location for the current program object and location is not
	 * equal to -1.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidLocation();

	/* Make sure GL_INVALID_VALUE is generated if <count> of
	 * glUniform*() (*dv() functions only) and glUniformMatrix*() is
	 * negative.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount();

	/* Make sure GL_INVALID_OPERATION is generated if <count> of
	 * glUniform*() (*dv() functions only) and glUniformMatrix*() is
	 * greater than 1 and the indicated uniform variable is not an
	 * array variable.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidCount();

	/* Make sure GL_INVALID_OPERATION is generated if a sampler is
	 * loaded by glUniform*() and glUniformMatrix*().
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingDoubleUniformFunctionsForSamplers();

	/* Make sure GL_INVALID_OPERATION is generated if glUniform*() and
	 * glUniformMatrix*() is used to load values for uniforms of
	 * boolean types.
	 */
	m_has_test_passed &= verifyErrorGenerationWhenCallingDoubleUniformFunctionsForBooleans();

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}